

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkValidatorUtils.hpp
# Opt level: O0

Result * CoreML::validateRecurrentActivationParams
                   (Result *__return_storage_ptr__,ActivationParams *params)

{
  NonlinearityTypeCase NVar1;
  MLActivationParamsNonlinearityType x;
  char *pcVar2;
  string local_1d0;
  stringstream local_1a0 [8];
  stringstream ss;
  ostream local_190 [376];
  ActivationParams *local_18;
  ActivationParams *params_local;
  
  local_18 = params;
  params_local = (ActivationParams *)__return_storage_ptr__;
  NVar1 = Specification::ActivationParams::NonlinearityType_case(params);
  switch(NVar1) {
  case kLinear:
    break;
  default:
    std::__cxx11::stringstream::stringstream(local_1a0);
    std::operator<<(local_190,"Recurrent non-linearity type ");
    x = Specification::ActivationParams::NonlinearityType_case(local_18);
    pcVar2 = MLActivationParamsNonlinearityType_Name(x);
    std::operator<<(local_190,pcVar2);
    std::operator<<(local_190," is not supported in this version of CoreML.");
    std::__cxx11::stringstream::str();
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_1d0);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::__cxx11::stringstream::~stringstream(local_1a0);
    return __return_storage_ptr__;
  case kReLU:
    break;
  case kTanh:
    break;
  case kScaledTanh:
    break;
  case kSigmoid:
    break;
  case kSigmoidHard:
  }
  Result::Result(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

inline Result validateRecurrentActivationParams(const Specification::ActivationParams& params) {
    // make sure params fall into expected values for recurrent activations
    switch (params.NonlinearityType_case()) {
        case Specification::ActivationParams::NonlinearityTypeCase::kLinear:
            break;
        case Specification::ActivationParams::NonlinearityTypeCase::kSigmoid:
            break;
        case Specification::ActivationParams::NonlinearityTypeCase::kTanh:
            break;
        case Specification::ActivationParams::NonlinearityTypeCase::kScaledTanh:
            break;
        case Specification::ActivationParams::NonlinearityTypeCase::kSigmoidHard:
            break;
        case Specification::ActivationParams::NonlinearityTypeCase::kReLU:
            break;
        default:
        {
            std::stringstream ss;
            ss << "Recurrent non-linearity type ";
            ss << MLActivationParamsNonlinearityType_Name(static_cast<MLActivationParamsNonlinearityType>(params.NonlinearityType_case()));
            ss << " is not supported in this version of CoreML.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, ss.str());
        }
    }
    return Result();
}